

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderCheckMark(ImVec2 pos,ImU32 col,float sz)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *pIVar3;
  ImVec2 *pIVar4;
  ImVec2 *pIVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  float thickness;
  float fVar10;
  float fVar11;
  float fVar12;
  
  thickness = sz / 5.0;
  if (thickness <= 1.0) {
    thickness = 1.0;
  }
  pIVar2 = GImGui->CurrentWindow;
  fVar10 = sz - thickness * 0.5;
  fVar11 = fVar10 / 3.0;
  fVar12 = pos.x + thickness * 0.25 + fVar11;
  fVar10 = (pos.y + thickness * 0.25 + fVar10) - fVar11 * 0.5;
  pIVar3 = pIVar2->DrawList;
  iVar8 = (pIVar3->_Path).Size;
  iVar1 = (pIVar3->_Path).Capacity;
  if (iVar8 == iVar1) {
    iVar8 = iVar8 + 1;
    if (iVar1 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar1 / 2 + iVar1;
    }
    if (iVar8 < iVar6) {
      iVar8 = iVar6;
    }
    if (iVar1 < iVar8) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      pIVar5 = (ImVec2 *)(*GImAllocatorAllocFunc)((long)iVar8 << 3,GImAllocatorUserData);
      pIVar4 = (pIVar3->_Path).Data;
      if (pIVar4 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar4,(long)(pIVar3->_Path).Size << 3);
        pIVar4 = (pIVar3->_Path).Data;
        if (pIVar4 != (ImVec2 *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (pIVar3->_Path).Data = pIVar5;
      (pIVar3->_Path).Capacity = iVar8;
    }
  }
  pIVar4 = (pIVar3->_Path).Data;
  iVar8 = (pIVar3->_Path).Size;
  pIVar4[iVar8].x = fVar12 - fVar11;
  pIVar4[iVar8].y = fVar10 - fVar11;
  (pIVar3->_Path).Size = (pIVar3->_Path).Size + 1;
  pIVar3 = pIVar2->DrawList;
  iVar8 = (pIVar3->_Path).Size;
  iVar1 = (pIVar3->_Path).Capacity;
  if (iVar8 == iVar1) {
    iVar8 = iVar8 + 1;
    if (iVar1 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar1 / 2 + iVar1;
    }
    if (iVar8 < iVar6) {
      iVar8 = iVar6;
    }
    if (iVar1 < iVar8) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      pIVar5 = (ImVec2 *)(*GImAllocatorAllocFunc)((long)iVar8 << 3,GImAllocatorUserData);
      pIVar4 = (pIVar3->_Path).Data;
      if (pIVar4 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar4,(long)(pIVar3->_Path).Size << 3);
        pIVar4 = (pIVar3->_Path).Data;
        if (pIVar4 != (ImVec2 *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (pIVar3->_Path).Data = pIVar5;
      (pIVar3->_Path).Capacity = iVar8;
    }
  }
  pIVar4 = (pIVar3->_Path).Data;
  iVar8 = (pIVar3->_Path).Size;
  pIVar4[iVar8].x = fVar12;
  pIVar4[iVar8].y = fVar10;
  (pIVar3->_Path).Size = (pIVar3->_Path).Size + 1;
  pIVar3 = pIVar2->DrawList;
  iVar8 = (pIVar3->_Path).Size;
  iVar1 = (pIVar3->_Path).Capacity;
  if (iVar8 == iVar1) {
    iVar8 = iVar8 + 1;
    if (iVar1 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar1 / 2 + iVar1;
    }
    if (iVar8 < iVar6) {
      iVar8 = iVar6;
    }
    if (iVar1 < iVar8) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      pIVar5 = (ImVec2 *)(*GImAllocatorAllocFunc)((long)iVar8 << 3,GImAllocatorUserData);
      pIVar4 = (pIVar3->_Path).Data;
      if (pIVar4 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar4,(long)(pIVar3->_Path).Size << 3);
        pIVar4 = (pIVar3->_Path).Data;
        if (pIVar4 != (ImVec2 *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (pIVar3->_Path).Data = pIVar5;
      (pIVar3->_Path).Capacity = iVar8;
    }
  }
  pIVar4 = (pIVar3->_Path).Data;
  iVar8 = (pIVar3->_Path).Size;
  pIVar4[iVar8].x = fVar11 + fVar11 + fVar12;
  pIVar4[iVar8].y = -fVar11 + -fVar11 + fVar10;
  (pIVar3->_Path).Size = (pIVar3->_Path).Size + 1;
  pIVar3 = pIVar2->DrawList;
  uVar9 = 0;
  ImDrawList::AddPolyline(pIVar3,(pIVar3->_Path).Data,(pIVar3->_Path).Size,col,false,thickness);
  iVar8 = (pIVar3->_Path).Capacity;
  if (iVar8 < 0) {
    uVar7 = iVar8 / 2 + iVar8;
    if (0 < (int)uVar7) {
      uVar9 = (ulong)uVar7;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pIVar5 = (ImVec2 *)(*GImAllocatorAllocFunc)(uVar9 * 8,GImAllocatorUserData);
    pIVar4 = (pIVar3->_Path).Data;
    if (pIVar4 != (ImVec2 *)0x0) {
      memcpy(pIVar5,pIVar4,(long)(pIVar3->_Path).Size << 3);
      pIVar4 = (pIVar3->_Path).Data;
      if (pIVar4 != (ImVec2 *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
    }
    (pIVar3->_Path).Data = pIVar5;
    (pIVar3->_Path).Capacity = (int)uVar9;
  }
  (pIVar3->_Path).Size = 0;
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImVec2 pos, ImU32 col, float sz)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness*0.5f;
    pos += ImVec2(thickness*0.25f, thickness*0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third*0.5f;
    window->DrawList->PathLineTo(ImVec2(bx - third, by - third));
    window->DrawList->PathLineTo(ImVec2(bx, by));
    window->DrawList->PathLineTo(ImVec2(bx + third*2, by - third*2));
    window->DrawList->PathStroke(col, false, thickness);
}